

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O0

bool __thiscall crnd::crn_unpacker::init_tables(crn_unpacker *this)

{
  uint8 *puVar1;
  bool bVar2;
  uint uVar3;
  uint buf_size;
  crn_unpacker *this_local;
  
  puVar1 = this->m_pData;
  uVar3 = crn_packed_uint::operator_cast_to_unsigned_int
                    ((crn_packed_uint *)&this->m_pHeader->m_tables_ofs);
  buf_size = crn_packed_uint::operator_cast_to_unsigned_int
                       ((crn_packed_uint *)&this->m_pHeader->m_tables_size);
  bVar2 = symbol_codec::start_decoding(&this->m_codec,puVar1 + uVar3,buf_size);
  if (bVar2) {
    bVar2 = symbol_codec::decode_receive_static_data_model
                      (&this->m_codec,&this->m_reference_encoding_dm);
    if (bVar2) {
      uVar3 = crn_packed_uint::operator_cast_to_unsigned_int
                        ((crn_packed_uint *)&(this->m_pHeader->m_color_endpoints).m_num);
      if ((uVar3 == 0) &&
         (uVar3 = crn_packed_uint::operator_cast_to_unsigned_int
                            ((crn_packed_uint *)&(this->m_pHeader->m_alpha_endpoints).m_num),
         uVar3 == 0)) {
        this_local._7_1_ = false;
      }
      else {
        uVar3 = crn_packed_uint::operator_cast_to_unsigned_int
                          ((crn_packed_uint *)&(this->m_pHeader->m_color_endpoints).m_num);
        if (uVar3 != 0) {
          bVar2 = symbol_codec::decode_receive_static_data_model
                            (&this->m_codec,this->m_endpoint_delta_dm);
          if (!bVar2) {
            return false;
          }
          bVar2 = symbol_codec::decode_receive_static_data_model
                            (&this->m_codec,this->m_selector_delta_dm);
          if (!bVar2) {
            return false;
          }
        }
        uVar3 = crn_packed_uint::operator_cast_to_unsigned_int
                          ((crn_packed_uint *)&(this->m_pHeader->m_alpha_endpoints).m_num);
        if (uVar3 != 0) {
          bVar2 = symbol_codec::decode_receive_static_data_model
                            (&this->m_codec,this->m_endpoint_delta_dm + 1);
          if (!bVar2) {
            return false;
          }
          bVar2 = symbol_codec::decode_receive_static_data_model
                            (&this->m_codec,this->m_selector_delta_dm + 1);
          if (!bVar2) {
            return false;
          }
        }
        symbol_codec::stop_decoding(&this->m_codec);
        this_local._7_1_ = true;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool init_tables()
        {
            if (!m_codec.start_decoding(m_pData + m_pHeader->m_tables_ofs, m_pHeader->m_tables_size))
                return false;

            if (!m_codec.decode_receive_static_data_model(m_reference_encoding_dm))
                return false;

            if ((!m_pHeader->m_color_endpoints.m_num) && (!m_pHeader->m_alpha_endpoints.m_num))
                return false;

            if (m_pHeader->m_color_endpoints.m_num)
            {
                if (!m_codec.decode_receive_static_data_model(m_endpoint_delta_dm[0]))
                    return false;
                if (!m_codec.decode_receive_static_data_model(m_selector_delta_dm[0]))
                    return false;
            }

            if (m_pHeader->m_alpha_endpoints.m_num)
            {
                if (!m_codec.decode_receive_static_data_model(m_endpoint_delta_dm[1]))
                    return false;
                if (!m_codec.decode_receive_static_data_model(m_selector_delta_dm[1]))
                    return false;
            }

            m_codec.stop_decoding();

            return true;
        }